

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O0

QVariant * __thiscall
AbstractStringSerialiserPrivate::stringToVariant
          (QVariant *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,QString *val)

{
  QDataStream local_a0 [8];
  QDataStream inStream;
  QByteArray local_80;
  QFlags<QByteArray::Base64Option> local_54;
  QByteArray local_50;
  undefined1 local_38 [8];
  QByteArray data;
  QString *val_local;
  AbstractStringSerialiserPrivate *this_local;
  QVariant *result;
  
  data.d.size = (qsizetype)val;
  QString::toLatin1(&local_50,val);
  QFlags<QByteArray::Base64Option>::QFlags(&local_54,Base64Encoding);
  QByteArray::fromBase64((QByteArray *)local_38,(QFlags_conflict1 *)&local_50);
  QByteArray::~QByteArray(&local_50);
  qUncompress(&local_80,(QByteArray *)local_38);
  QByteArray::operator=((QByteArray *)local_38,&local_80);
  QByteArray::~QByteArray(&local_80);
  QDataStream::QDataStream(local_a0,(QByteArray *)local_38);
  QDataStream::setVersion(local_a0,(this->super_AbstractModelSerialiserPrivate).m_streamVersion);
  ::QVariant::QVariant(__return_storage_ptr__);
  ::operator>>(local_a0,(QVariant *)__return_storage_ptr__);
  QDataStream::~QDataStream(local_a0);
  QByteArray::~QByteArray((QByteArray *)local_38);
  return __return_storage_ptr__;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::stringToVariant(const QString &val) const
{
    QByteArray data = QByteArray::fromBase64(val.toLatin1());
    data = qUncompress(data);
    QDataStream inStream(data);
    inStream.setVersion(m_streamVersion);
    QVariant result;
    inStream >> result;
    return result;
}